

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

AFM_Token afm_tokenize(char *key,FT_Offset len)

{
  char cVar1;
  int iVar2;
  long lVar3;
  AFM_Token AVar4;
  char **ppcVar5;
  
  cVar1 = *key;
  AVar4 = AFM_TOKEN_ASCENDER;
  do {
    if (0x49 < (int)AVar4) {
      return AFM_TOKEN_UNKNOWN;
    }
    lVar3 = (long)(int)AVar4;
    if (*afm_key_table[lVar3] == cVar1) {
      ppcVar5 = afm_key_table + lVar3;
      do {
        lVar3 = lVar3 + 1;
        if (**ppcVar5 != cVar1) {
          return AFM_TOKEN_UNKNOWN;
        }
        iVar2 = strncmp(*ppcVar5,key,len);
        if (iVar2 == 0) {
          return AVar4;
        }
        AVar4 = AVar4 + AFM_TOKEN_AXISLABEL;
        ppcVar5 = ppcVar5 + 1;
      } while ((int)lVar3 != 0x4a);
      AVar4 = N_AFM_TOKENS;
    }
    AVar4 = AVar4 + AFM_TOKEN_AXISLABEL;
  } while( true );
}

Assistant:

static AFM_Token
  afm_tokenize( const char*  key,
                FT_Offset    len )
  {
    int  n;


    for ( n = 0; n < N_AFM_TOKENS; n++ )
    {
      if ( *( afm_key_table[n] ) == *key )
      {
        for ( ; n < N_AFM_TOKENS; n++ )
        {
          if ( *( afm_key_table[n] ) != *key )
            return AFM_TOKEN_UNKNOWN;

          if ( ft_strncmp( afm_key_table[n], key, len ) == 0 )
            return (AFM_Token) n;
        }
      }
    }

    return AFM_TOKEN_UNKNOWN;
  }